

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_on_ping_received(nghttp2_session *session,nghttp2_frame *frame)

{
  nghttp2_on_frame_recv_callback p_Var1;
  int iVar2;
  
  if ((frame->hd).stream_id != 0) {
    iVar2 = session_handle_invalid_connection(session,frame,-0x1f9,"PING: stream_id != 0");
    return iVar2;
  }
  if (((((session->opt_flags & 8) != 0) || (((frame->hd).flags & 1) != 0)) ||
      (iVar2 = session_is_closing(session), iVar2 != 0)) ||
     (iVar2 = nghttp2_session_add_ping(session,'\x01',(frame->ping).opaque_data), iVar2 == 0)) {
    p_Var1 = (session->callbacks).on_frame_recv_callback;
    if ((p_Var1 != (nghttp2_on_frame_recv_callback)0x0) &&
       (iVar2 = (*p_Var1)(session,frame,session->user_data), iVar2 != 0)) {
      return -0x386;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int nghttp2_session_on_ping_received(nghttp2_session *session,
                                     nghttp2_frame *frame) {
  int rv = 0;
  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "PING: stream_id != 0");
  }
  if ((session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_PING_ACK) == 0 &&
      (frame->hd.flags & NGHTTP2_FLAG_ACK) == 0 &&
      !session_is_closing(session)) {
    /* Peer sent ping, so ping it back */
    rv = nghttp2_session_add_ping(session, NGHTTP2_FLAG_ACK,
                                  frame->ping.opaque_data);
    if (rv != 0) {
      return rv;
    }
  }
  return session_call_on_frame_received(session, frame);
}